

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O2

void __thiscall MetaSim::DebugStream::enter(DebugStream *this,string *s)

{
  bool bVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  Simulation *pSVar3;
  Tick TVar4;
  
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->_dbgStack,this->_isDebug);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->_dbgLevels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->_dbgLevels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,s);
  if (_Var2._M_current !=
      (this->_dbgLevels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar3 = Simulation::getInstance();
    TVar4 = Simulation::getTime(pSVar3);
    if ((this->_t1).v <= TVar4.v) {
      pSVar3 = Simulation::getInstance();
      TVar4 = Simulation::getTime(pSVar3);
      bVar1 = TVar4.v <= (this->_t2).v;
      goto LAB_00161118;
    }
  }
  bVar1 = false;
LAB_00161118:
  this->_isDebug = bVar1;
  this->_isIndenting = true;
  return;
}

Assistant:

void DebugStream::enter(std::string s) 
    {
        _dbgStack.push_back(_isDebug);
        std::vector<std::string>::iterator i = 
            find(_dbgLevels.begin(), _dbgLevels.end(), s);
        if (i == _dbgLevels.end()
            || (SIMUL.getTime() < _t1) 
            || (SIMUL.getTime() > _t2)) 
            _isDebug = false;
        else
            _isDebug = true;
        _isIndenting = true;
    }